

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void pugi::impl::anon_unknown_0::text_output
               (xml_buffered_writer *writer,char_t *s,chartypex_t type,uint flags)

{
  uint in_ECX;
  char_t *in_stack_00000018;
  xml_buffered_writer *in_stack_00000020;
  
  if ((in_ECX & 0x10) == 0) {
    text_output_escaped(writer,s,type,flags);
  }
  else {
    xml_buffered_writer::write_string(in_stack_00000020,in_stack_00000018);
  }
  return;
}

Assistant:

PUGI_IMPL_FN void text_output(xml_buffered_writer& writer, const char_t* s, chartypex_t type, unsigned int flags)
	{
		if (flags & format_no_escapes)
			writer.write_string(s);
		else
			text_output_escaped(writer, s, type, flags);
	}